

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall Shader::fragment(Shader *this,Model *model,vec3f bar,TGAColor *color)

{
  double dVar1;
  double dVar2;
  int i;
  uint8_t auVar3 [4];
  TGAColor TVar4;
  vec<3UL,_double> *pvVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  vec<2UL,_double> vVar11;
  TGAColor c;
  vec2f uv;
  vec3f l;
  vec4f sb_p;
  vec3f n;
  vec<4UL,_double> local_f0;
  vec3f local_d0;
  vec<4UL,_double> local_b8;
  vec2f local_98;
  vec<3UL,_double> local_88;
  vec<4UL,_double> local_68;
  vec<3UL,_double> local_48;
  
  operator*((vec<3UL,_double> *)&local_b8,&this->varying_tri,&bar);
  embed<4ul,3ul,double>(&local_f0,(vec<3UL,_double> *)&local_b8,1.0);
  operator*(&local_68,&this->uniform_Mshadow,&local_f0);
  operator/(&local_f0,&local_68,local_68.data + 3);
  local_68.data[2] = local_f0.data[2];
  local_68.data[3] = local_f0.data[3];
  local_68.data[1] = local_f0.data[1];
  dVar2 = DepthBuffer::get(this->shadow_buffer,
                           (long)(int)(double)CONCAT44(local_f0.data[0]._4_4_,local_f0.data[0]._0_4_
                                                      ),(long)(int)local_f0.data[1]);
  dVar2 = *(double *)(&DAT_00108050 + (ulong)(dVar2 <= local_68.data[2] + 43.34) * 8);
  vVar11 = operator*(&this->varying_uv,&bar);
  local_98.x = vVar11.x;
  local_98.y = vVar11.y;
  Model::normal(&local_d0,model,&local_98);
  pvVar5 = vec<3UL,_double>::normalize(&local_d0);
  embed<4ul,3ul,double>(&local_b8,pvVar5,1.0);
  operator*(&local_f0,&this->uniform_MIT,&local_b8);
  proj<3ul,4ul,double>(&local_88,&local_f0);
  pvVar5 = vec<3UL,_double>::normalize(&local_88);
  local_48.x = pvVar5->x;
  local_48.y = pvVar5->y;
  local_48.z = pvVar5->z;
  embed<4ul,3ul,double>(&local_b8,&light_dir,1.0);
  operator*(&local_f0,&this->uniform_M,&local_b8);
  proj<3ul,4ul,double>(&local_d0,&local_f0);
  pvVar5 = vec<3UL,_double>::normalize(&local_d0);
  local_88.x = pvVar5->x;
  local_88.y = pvVar5->y;
  local_88.z = pvVar5->z;
  local_d0.x = dot<3ul,double>(&local_48,&local_88);
  local_d0.x = local_d0.x + local_d0.x;
  operator*((vec<3UL,_double> *)&local_b8,&local_48,&local_d0.x);
  operator-((vec<3UL,_double> *)&local_f0,(vec<3UL,_double> *)&local_b8,&local_88);
  pvVar5 = vec<3UL,_double>::normalize((vec<3UL,_double> *)&local_f0);
  uVar7 = 0;
  uVar8 = 0;
  dVar1 = pvVar5->z;
  if (0.0 <= dVar1) {
    uVar7 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  dVar1 = Model::specular(model,&local_98);
  dVar1 = pow((double)CONCAT44(uVar8,uVar7),dVar1);
  dVar10 = dot<3ul,double>(&local_48,&local_88);
  uVar7 = SUB84(dVar10,0);
  uVar8 = (undefined4)((ulong)dVar10 >> 0x20);
  if (dVar10 <= 0.0) {
    uVar7 = 0;
    uVar8 = 0;
  }
  TVar4 = Model::diffuse(model,&local_98);
  auVar3 = TVar4.bgra;
  local_f0.data[0]._0_1_ = auVar3[0];
  local_f0.data[0]._1_1_ = auVar3[1];
  local_f0.data[0]._2_1_ = auVar3[2];
  local_f0.data[0]._3_1_ = auVar3[3];
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    dVar9 = (double)*(byte *)((long)local_f0.data + lVar6) * dVar2 *
            ((double)CONCAT44(uVar8,uVar7) * 1.2 + dVar1 * 0.6) + 20.0;
    dVar10 = 255.0;
    if (dVar9 <= 255.0) {
      dVar10 = dVar9;
    }
    color->bgra[lVar6] = (uint8_t)(int)dVar10;
  }
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec4f sb_p = uniform_Mshadow *
                     embed<4>(varying_tri * bar);  // corresponding point in the shadow buffer
        sb_p = sb_p / sb_p[3];
        double shadow = .3 + .7 * (shadow_buffer.get(int(sb_p[0]), int(sb_p[1])) <=
                                   sb_p[2] + 43.34);  // magic coeff to avoid z-fighting
        // shadow = std::max(0., shadow);

        // shadow = .7 * shadow_buffer.get(int(sb_p[0]), int(sb_p[1]));
        vec2f uv = varying_uv * bar;  // interpolate uv for the current pixel
        vec3f n =
            proj<3>(uniform_MIT * embed<4>(model.normal(uv).normalize())).normalize();  // normal
        vec3f l = proj<3>(uniform_M * embed<4>(light_dir)).normalize();  // light vector
        vec3f r = (n * (dot(n, l) * 2.) - l).normalize();                // reflected light
        double spec = std::pow(std::max(r.z, 0.0), model.specular(uv));
        double diff = std::max(0., dot(n, l));
        TGAColor c = model.diffuse(uv);
        for (int i = 0; i < 3; i++) {
            color[i] =
                static_cast<uint8_t>(std::min(20 + c[i] * shadow * (1.2 * diff + .6 * spec), 255.));
            // color[i] = (uint8_t)(model.specular(uv) + 64);
        }

        return false;
    }